

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O3

void game::userTurn(Game *game)

{
  ulong in_RAX;
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  int i;
  int j;
  undefined8 local_38;
  
  local_38 = in_RAX & 0xffffffff00000000;
  do {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    poVar1 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"X:  ",4);
    std::istream::operator>>((istream *)&std::cin,(int *)&local_38);
    if ((uint)local_38 < 3) {
      while( true ) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
        std::ostream::put('X');
        poVar1 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Y:  ",4);
        std::istream::operator>>((istream *)&std::cin,(int *)((long)&local_38 + 4));
        if (local_38._4_4_ < 3) break;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,anon_var_dwarf_23a2,0x23);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
        std::ostream::put('X');
        std::ostream::flush();
      }
      if (game->bord[(int)(uint)local_38][(int)local_38._4_4_] == ' ') {
        game->bord[(int)(uint)local_38][(int)local_38._4_4_] = game->userChar;
        return;
      }
      lVar2 = 0x1b;
      pcVar3 = anon_var_dwarf_23ac;
    }
    else {
      lVar2 = 0x23;
      pcVar3 = anon_var_dwarf_2382;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
  } while( true );
}

Assistant:

void userTurn(Game *game){
        int i = 0,j;
        bool flag_i = true, flag_j = true, flag_all = true;
        while (flag_all) {
            while (flag_i) {
                std::cout << std::endl << "X:  ";
                std::cin >> i;
                if ((i < 0) || (i > 2)) {
                    std::cout << "Введите x корректно" << std::endl;
                } else {
                    flag_i = false;
                }
            }

            while (flag_j) {
                std::cout << std::endl << "Y:  ";
                std::cin >> j;
                if ((j < 0) || (j > 2)) {
                    std::cout << "Введите y корректно" << std::endl;
                } else {
                    flag_j = false;
                }
            }
            if (game->bord[i][j] == ' '){
                flag_all = false;
            }else{
                std::cout << "Не жульничайте" << std::endl;
                flag_i = true;
                flag_j = true;
            }
        }
        game->bord[i][j] = game->userChar;
    }